

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrobjs.c
# Opt level: O1

void pfr_slot_done(FT_GlyphSlot pfrslot)

{
  FT_Memory memory;
  
  memory = *(FT_Memory *)pfrslot[1].generic.finalizer;
  ft_mem_free(memory,pfrslot[1].face);
  *(undefined8 *)((long)&pfrslot[1].library + 4) = 0;
  *(undefined8 *)((long)&pfrslot[1].face + 4) = 0;
  *(undefined4 *)((long)&pfrslot[1].next + 4) = 0;
  ft_mem_free(memory,pfrslot[1].generic.data);
  *(undefined8 *)((long)&pfrslot[1].generic.data + 1) = 0;
  *(undefined8 *)((long)&pfrslot[1].generic.finalizer + 1) = 0;
  *(undefined8 *)&pfrslot[1].glyph_index = 0;
  pfrslot[1].generic.data = (void *)0x0;
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  pfr_slot_done( FT_GlyphSlot  pfrslot )        /* PFR_Slot */
  {
    PFR_Slot  slot = (PFR_Slot)pfrslot;


    pfr_glyph_done( &slot->glyph );
  }